

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O3

ZyanStatus
ZydisFormatterATTPrintMnemonic
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZydisMemoryOperandType ZVar2;
  ZydisBranchType ZVar3;
  ZyanUSize ZVar4;
  void *pvVar5;
  ZyanStatus ZVar6;
  ZyanU32 ZVar7;
  ZydisShortString *pZVar8;
  ulong uVar9;
  ZydisLetterCase letter_case;
  ZydisDecodedOperand *operand;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x115,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x116,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x117,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x118,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x119,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  pZVar8 = ZydisMnemonicGetStringWrapped(context->instruction->mnemonic);
  if (pZVar8 == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      ZVar6 = ZydisStringAppendShortCase
                        (&buffer->string,&STR_INVALID_MNEMONIC,formatter->case_mnemonic);
      if ((int)ZVar6 < 0) {
        return ZVar6;
      }
    }
    else {
      ZVar4 = (buffer->string).vector.size;
      if (0xfe < ZVar4 - 1) {
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      if (buffer->capacity <= ZVar4 + 10) {
        return 0x80100009;
      }
      pvVar5 = (buffer->string).vector.data;
      *(char *)((long)pvVar5 + -1) = (char)ZVar4;
      *(undefined8 *)((long)pvVar5 + ZVar4) = 0x696c61766e690006;
      *(undefined2 *)((long)pvVar5 + ZVar4 + 8) = 100;
      uVar9 = buffer->capacity - (ZVar4 + 2);
      buffer->capacity = uVar9;
      ppvVar1 = &(buffer->string).vector.data;
      *ppvVar1 = (void *)((long)*ppvVar1 + ZVar4 + 2);
      (buffer->string).vector.size = 8;
      if (0xfe < uVar9) {
        uVar9 = 0xff;
      }
      (buffer->string).vector.capacity = uVar9;
    }
  }
  else {
    if ((buffer->is_token_list != '\0') &&
       (ZVar6 = ZydisFormatterBufferAppend(buffer,'\x06'), (int)ZVar6 < 0)) {
      return ZVar6;
    }
    if (((context->instruction->meta).branch_type == ZYDIS_BRANCH_TYPE_FAR) &&
       (ZVar6 = ZydisStringAppendShortCase(&buffer->string,&STR_FAR_ATT,formatter->case_mnemonic),
       (int)ZVar6 < 0)) {
      return ZVar6;
    }
    ZVar6 = ZydisStringAppendShortCase(&buffer->string,pZVar8,formatter->case_mnemonic);
    if ((int)ZVar6 < 0) {
      return ZVar6;
    }
    uVar9 = (ulong)context->instruction->operand_count_visible;
    if (uVar9 != 0) {
      operand = context->operands;
      do {
        if ((operand->type == ZYDIS_OPERAND_TYPE_MEMORY) &&
           ((ZVar2 = (operand->field_10).mem.type, ZVar2 == ZYDIS_MEMOP_TYPE_MEM ||
            (ZVar2 == ZYDIS_MEMOP_TYPE_MAX_VALUE)))) {
          ZVar7 = ZydisFormatterHelperGetExplicitSize(formatter,context,operand);
          if ((int)ZVar7 < 0x40) {
            if (ZVar7 == 8) {
              if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00116263;
              ZVar4 = (buffer->string).vector.size;
              if (ZVar4 == 0) goto LAB_00116282;
              if ((buffer->string).vector.capacity < ZVar4 + 1) break;
              *(undefined2 *)((long)(buffer->string).vector.data + (ZVar4 - 1)) = 0x62;
            }
            else if (ZVar7 == 0x10) {
              if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00116263;
              ZVar4 = (buffer->string).vector.size;
              if (ZVar4 == 0) goto LAB_00116282;
              if ((buffer->string).vector.capacity < ZVar4 + 1) break;
              *(undefined2 *)((long)(buffer->string).vector.data + (ZVar4 - 1)) = 0x77;
            }
            else {
              if (ZVar7 != 0x20) break;
              if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00116263;
              ZVar4 = (buffer->string).vector.size;
              if (ZVar4 == 0) goto LAB_00116282;
              if ((buffer->string).vector.capacity < ZVar4 + 1) break;
              *(undefined2 *)((long)(buffer->string).vector.data + (ZVar4 - 1)) = 0x6c;
            }
          }
          else if ((int)ZVar7 < 0x100) {
            if (ZVar7 == 0x40) {
              if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00116263;
              ZVar4 = (buffer->string).vector.size;
              if (ZVar4 == 0) goto LAB_00116282;
              if ((buffer->string).vector.capacity < ZVar4 + 1) break;
              *(undefined2 *)((long)(buffer->string).vector.data + (ZVar4 - 1)) = 0x71;
            }
            else {
              if (ZVar7 != 0x80) break;
              if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_00116263:
                __assert_fail("!destination->vector.allocator",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                              ,0xeb,
                              "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                             );
              }
              ZVar4 = (buffer->string).vector.size;
              if (ZVar4 == 0) {
LAB_00116282:
                __assert_fail("destination->vector.size && source->size",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                              ,0xec,
                              "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                             );
              }
              if ((buffer->string).vector.capacity < ZVar4 + 1) break;
              *(undefined2 *)((long)(buffer->string).vector.data + (ZVar4 - 1)) = 0x78;
            }
          }
          else if (ZVar7 == 0x100) {
            if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00116263;
            ZVar4 = (buffer->string).vector.size;
            if (ZVar4 == 0) goto LAB_00116282;
            if ((buffer->string).vector.capacity < ZVar4 + 1) break;
            *(undefined2 *)((long)(buffer->string).vector.data + (ZVar4 - 1)) = 0x79;
          }
          else {
            if (ZVar7 != 0x200) break;
            if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00116263;
            ZVar4 = (buffer->string).vector.size;
            if (ZVar4 == 0) goto LAB_00116282;
            if ((buffer->string).vector.capacity < ZVar4 + 1) break;
            *(undefined2 *)((long)(buffer->string).vector.data + (ZVar4 - 1)) = 0x7a;
          }
          ZVar4 = (buffer->string).vector.size;
          pvVar5 = (buffer->string).vector.data;
          (buffer->string).vector.size = ZVar4 + 1;
          if (*(char *)((long)pvVar5 + ZVar4) != '\0') {
            __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                          ,0xf7,
                          "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                         );
          }
          break;
        }
        operand = operand + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    if ((formatter->print_branch_size != '\0') &&
       (ZVar3 = (context->instruction->meta).branch_type, ZVar3 != ZYDIS_BRANCH_TYPE_NONE)) {
      if (ZVar3 == ZYDIS_BRANCH_TYPE_NEAR) {
        letter_case = formatter->case_mnemonic;
        pZVar8 = &STR_NEAR;
      }
      else {
        if (ZVar3 != ZYDIS_BRANCH_TYPE_SHORT) {
          return 0x80100004;
        }
        letter_case = formatter->case_mnemonic;
        pZVar8 = &STR_SHORT;
      }
      ZVar6 = ZydisStringAppendShortCase(&buffer->string,pZVar8,letter_case);
      return ZVar6;
    }
  }
  return 0x100000;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    const ZydisShortString* mnemonic = ZydisMnemonicGetStringWrapped(
        context->instruction->mnemonic);
    if (!mnemonic)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_MNEMONIC, formatter->case_mnemonic);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_MNEMONIC);
    if (context->instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_FAR)
    {
        ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, &STR_FAR_ATT,
            formatter->case_mnemonic));
    }
    ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, mnemonic, formatter->case_mnemonic));

    // Append operand-size suffix
    ZyanU32 size = 0;
    for (ZyanU8 i = 0; i < context->instruction->operand_count_visible; ++i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];
        if ((operand->type == ZYDIS_OPERAND_TYPE_MEMORY) &&
            ((operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
             (operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB)))
        {
            size = ZydisFormatterHelperGetExplicitSize(formatter, context, operand);
            break;
        }
    }

    switch (size)
    {
    case   8: ZydisStringAppendShort(&buffer->string, &STR_SIZE_8_ATT  ); break;
    case  16: ZydisStringAppendShort(&buffer->string, &STR_SIZE_16_ATT ); break;
    case  32: ZydisStringAppendShort(&buffer->string, &STR_SIZE_32_ATT ); break;
    case  64: ZydisStringAppendShort(&buffer->string, &STR_SIZE_64_ATT ); break;
    case 128: ZydisStringAppendShort(&buffer->string, &STR_SIZE_128_ATT); break;
    case 256: ZydisStringAppendShort(&buffer->string, &STR_SIZE_256_ATT); break;
    case 512: ZydisStringAppendShort(&buffer->string, &STR_SIZE_512_ATT); break;
    default:
        break;
    }

    if (formatter->print_branch_size)
    {
        switch (context->instruction->meta.branch_type)
        {
        case ZYDIS_BRANCH_TYPE_NONE:
            break;
        case ZYDIS_BRANCH_TYPE_SHORT:
            return ZydisStringAppendShortCase(&buffer->string, &STR_SHORT,
                formatter->case_mnemonic);
        case ZYDIS_BRANCH_TYPE_NEAR:
            return ZydisStringAppendShortCase(&buffer->string, &STR_NEAR,
                formatter->case_mnemonic);
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}